

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O3

chunk_conflict * river_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  wchar_t wVar1;
  _Bool _Var2;
  wchar_t wVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  chunk *c;
  feature *pfVar7;
  void *p_00;
  wchar_t wVar8;
  ulong uVar9;
  wchar_t *pwVar10;
  int iVar11;
  long lVar12;
  loc grid;
  int iVar13;
  loc grid_00;
  loc grid_01;
  uint uVar14;
  long lVar15;
  long lVar16;
  loc grid_02;
  wchar_t wVar17;
  loc lVar18;
  loc lVar19;
  loc_conflict lVar20;
  bool bVar21;
  wchar_t form_feats [7];
  
  wVar17 = (wchar_t)p->place;
  wVar3 = (wchar_t)p->last_place;
  form_feats[0] = FEAT_TREE;
  form_feats[1] = FEAT_PASS_RUBBLE;
  form_feats[2] = FEAT_MAGMA;
  form_feats[3] = FEAT_GRANITE;
  form_feats[4] = FEAT_TREE2;
  form_feats[5] = FEAT_QUARTZ;
  form_feats[6] = FEAT_NONE;
  c = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  c->depth = (int)p->depth;
  c->place = wVar17;
  wVar1 = c->height;
  wVar8 = wVar1 - (wVar1 >> 0x1f);
  if (L'\0' < wVar1) {
    uVar9 = (ulong)(uint)c->width;
    lVar12 = 0;
    lVar15 = 0;
    wVar6 = wVar1;
    do {
      if (0 < (int)uVar9) {
        lVar16 = 0;
        do {
          square_set_feat((chunk_conflict *)c,(loc)(lVar12 + lVar16),FEAT_GRASS);
          lVar16 = lVar16 + 1;
          uVar9 = (ulong)c->width;
        } while (lVar16 < (long)uVar9);
        wVar6 = c->height;
      }
      wVar8 = (wchar_t)uVar9;
      lVar15 = lVar15 + 1;
      lVar12 = lVar12 + 0x100000000;
    } while (lVar15 < wVar6);
  }
  iVar13 = wVar1 / 2;
  alloc_paths((chunk_conflict *)c,(player *)(ulong)(uint)wVar17,wVar3,wVar8);
  lVar18.x = (p->grid).x;
  lVar18.y = (p->grid).y;
  pfVar7 = square_feat((chunk_conflict *)c,lVar18);
  wVar1 = pfVar7->fidx;
  set_num_vaults((chunk_conflict *)c);
  make_edges((chunk_conflict *)c,true,false);
  uVar5 = c->width / 3;
  uVar4 = Rand_div(uVar5);
  p_00 = mem_zalloc((long)c->height << 2);
  if (L'\x02' < c->height) {
    iVar11 = uVar5 + uVar4;
    lVar12 = 1;
    do {
      *(int *)((long)p_00 + lVar12 * 4) = iVar11;
      uVar5 = Rand_div(5);
      uVar14 = (iVar11 - uVar5) - 10;
      uVar5 = Rand_div(5);
      if ((int)uVar14 < (int)(uVar5 + iVar11 + 10)) {
        do {
          lVar18 = (loc)((ulong)uVar14 | lVar12 << 0x20);
          square_set_feat((chunk_conflict *)c,lVar18,FEAT_WATER);
          square_mark((chunk_conflict *)c,lVar18);
          uVar14 = uVar14 + 1;
          uVar5 = Rand_div(5);
        } while ((int)uVar14 < (int)(uVar5 + iVar11 + 10));
      }
      uVar5 = Rand_div(3);
      iVar11 = iVar11 + uVar5 + -1;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (long)c->height + -1);
  }
  lVar12 = (long)iVar13;
  lVar18 = (loc)loc(*(int *)((long)p_00 + lVar12 * 4),iVar13);
  if (world->levels[wVar17].down != (char *)0x0) {
    num_wild_vaults = L'\0';
    if (world->levels[wVar17].locality == LOC_SIRION_VALE) {
      lVar15 = lVar12 + -10;
      do {
        uVar9 = (ulong)(*(int *)((long)p_00 + lVar15 * 4) - 0xb);
        do {
          uVar14 = (int)uVar9 + 1;
          uVar9 = (ulong)uVar14;
          lVar19 = (loc)(lVar15 << 0x20 | uVar9);
          wVar8 = distance((loc_conflict)lVar18,(loc_conflict)lVar19);
          pwVar10 = &FEAT_WATER;
          if (wVar8 < L'\x06') {
            pwVar10 = &FEAT_GRASS;
          }
          square_set_feat((chunk_conflict *)c,lVar19,*pwVar10);
          wVar8 = distance((loc_conflict)lVar18,(loc_conflict)lVar19);
          if (wVar8 < L'\x02') {
            square_set_feat((chunk_conflict *)c,lVar19,FEAT_GRANITE);
          }
        } while ((int)uVar14 < *(int *)((long)p_00 + lVar15 * 4) + 9);
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar13 + 10);
      lVar19 = (loc)loc(*(int *)((long)p_00 + lVar12 * 4),iVar13 + 1);
      square_set_feat((chunk_conflict *)c,lVar19,FEAT_CLOSED);
      square_set_feat((chunk_conflict *)c,lVar18,FEAT_MORE);
      wVar3 = level_topography(wVar3);
      if (wVar3 == L'\a') {
        player_place((chunk_conflict2 *)c,p,(loc_conflict)lVar18);
      }
    }
    else {
      lVar20 = loc(*(int *)((long)p_00 + lVar12 * 4) + -6,iVar13);
      wVar8 = iVar13 + L'\xffffffff';
      do {
        wVar17 = *(int *)((long)p_00 + lVar12 * 4) + L'\xfffffff1';
        do {
          lVar19.y = wVar8;
          lVar19.x = wVar17;
          _Var2 = loc_eq((loc_conflict)lVar19,lVar20);
          if (_Var2) {
            square_set_feat((chunk_conflict *)c,lVar19,FEAT_MORE);
            wVar6 = level_topography(wVar3);
            if (wVar6 == L'\a') {
              player_place((chunk_conflict2 *)c,p,(loc_conflict)lVar19);
            }
          }
          else {
            square_set_feat((chunk_conflict *)c,lVar19,FEAT_GRANITE);
          }
          wVar17 = wVar17 + L'\x01';
          wVar6 = *(int *)((long)p_00 + lVar12 * 4) + L'\xfffffffb';
        } while (wVar17 < wVar6);
        do {
          grid_00.y = wVar8;
          grid_00.x = wVar6;
          square_set_feat((chunk_conflict *)c,grid_00,FEAT_ROAD);
          wVar6 = wVar6 + L'\x01';
          wVar17 = *(wchar_t *)((long)p_00 + lVar12 * 4);
        } while (wVar6 < wVar17);
        wVar17 = wVar17 + L'\xfffffffb';
        do {
          wVar17 = wVar17 + L'\x01';
          grid_01.y = wVar8;
          grid_01.x = wVar17;
          square_set_feat((chunk_conflict *)c,grid_01,FEAT_WATER);
        } while (wVar17 < *(int *)((long)p_00 + lVar12 * 4) + L'\x04');
        bVar21 = wVar8 != iVar13 + L'\x01';
        wVar8 = wVar8 + L'\x01';
      } while (bVar21);
    }
  }
  if (L'\xffffffec' < c->depth) {
    iVar13 = 0;
    do {
      uVar5 = Rand_div(c->height + L'\xfffffffe');
      uVar4 = Rand_div(c->width + L'\xfffffffe');
      lVar20.y = uVar5 + 1;
      lVar20.x = uVar4 + 1;
      wVar3 = make_formation((chunk_conflict *)c,p,lVar20,FEAT_GRASS,FEAT_GRASS,form_feats,"River",
                             c->depth / 2);
      iVar13 = iVar13 + wVar3;
    } while (iVar13 < c->depth * 0x32 + 1000);
  }
  wVar3 = c->height;
  if (L'\0' < wVar3) {
    uVar9 = (ulong)(uint)c->width;
    lVar12 = 0;
    lVar15 = 0;
    do {
      if (0 < (int)uVar9) {
        lVar16 = 0;
        do {
          square_unmark((chunk_conflict *)c,(loc)(lVar12 + lVar16));
          lVar16 = lVar16 + 1;
          uVar9 = (ulong)c->width;
        } while (lVar16 < (long)uVar9);
        wVar3 = c->height;
      }
      lVar15 = lVar15 + 1;
      lVar12 = lVar12 + 0x100000000;
    } while (lVar15 < wVar3);
  }
  wVar3 = (p->grid).x;
  wVar8 = (p->grid).y;
  while( true ) {
    grid_02.y = wVar8;
    grid_02.x = wVar3;
    pfVar7 = square_feat((chunk_conflict *)c,grid_02);
    if ((pfVar7->fidx != FEAT_WATER) &&
       (pfVar7 = square_feat((chunk_conflict *)c,grid_02), pfVar7->fidx != FEAT_GRANITE)) break;
    wVar3 = wVar3 + L'\x01';
  }
  _Var2 = loc_eq((loc_conflict)grid_02,p->grid);
  if (!_Var2) {
    player_place((chunk_conflict2 *)c,p,(loc_conflict)grid_02);
    square_set_feat((chunk_conflict *)c,grid_02,wVar1);
    wVar1 = (p->grid).y;
    if (0 < (long)wVar1) {
      lVar12 = (long)wVar1 + 1;
      grid.y = wVar1;
      grid.x = wVar3;
      do {
        _Var2 = square_ispassable((chunk_conflict *)c,grid);
        if (!_Var2) {
          square_set_feat((chunk_conflict *)c,grid,FEAT_ROAD);
        }
        lVar12 = lVar12 + -1;
        grid = (loc)((long)grid + -0x100000000);
      } while (1 < lVar12);
    }
  }
  populate((chunk_conflict *)c,false);
  mem_free(p_00);
  _Var2 = verify_level((chunk_conflict *)c);
  if (!_Var2) {
    wipe_mon_list(c,p);
    cave_free((chunk_conflict *)c);
    *p_error = "wilderness level had generation issues";
    c = (chunk *)0x0;
  }
  return (chunk_conflict *)c;
}

Assistant:

struct chunk *river_gen(struct player *p, int height, int width,
						const char **p_error)
{
	struct loc grid, centre;
	int i, y1;
	int *mid;
	int place = p->place;
	int last_place = p->last_place;
	int form_grids = 0;
	int path;

	int form_feats[] = { FEAT_TREE, FEAT_PASS_RUBBLE, FEAT_MAGMA, FEAT_GRANITE,
						 FEAT_TREE2, FEAT_QUARTZ, FEAT_NONE };

    /* Make the level */
    struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = place;
	y1 = c->height / 2;

	/* Start with grass */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create grass */
			square_set_feat(c, grid, FEAT_GRASS);
		}
	}

	/* Place 2 or 3 paths to neighbouring places, place player -NRM- */
	alloc_paths(c, p, place, last_place);

	/* Remember the path in case it has to move */
	path = square_feat(c, p->grid)->fidx;

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, true, false);

	/* Place the river, start in the middle third */
	i = c->width / 3 + randint0(c->width / 3);
	mid = mem_zalloc(c->height * sizeof(int));
	for (grid.y = 1; grid.y < c->height - 1; grid.y++) {
		/* Remember the midpoint */
		mid[grid.y] = i;

		for (grid.x = i - randint0(5) - 10; grid.x < i + randint0(5) + 10;
			 grid.x++) {
			/* Make the river */
			square_set_feat(c, grid, FEAT_WATER);
			square_mark(c, grid);
		}
		/* Meander */
		i += randint0(3) - 1;
	}

	/* Mark the centre */
	centre = loc(mid[y1], y1);

	/* Special dungeon entrances */
	if (world->levels[place].down) {
		/* No vaults */
		num_wild_vaults = 0;

		/* If we're at Sauron's Isle... */
		if (world->levels[place].locality == LOC_SIRION_VALE) {
			for (grid.y = y1 - 10; grid.y < y1 + 10; grid.y++) {
				for (grid.x = mid[grid.y] - 10; grid.x < mid[grid.y] + 10;
					 grid.x++) {
					if (distance(centre, grid) < 6) {
						/* ...make Tol-In-Gaurhoth... */
						square_set_feat(c, grid, FEAT_GRASS);
					} else {
						/* ...surround it by water... */
						square_set_feat(c, grid, FEAT_WATER);
					}
					/* ...and build the tower... */
					if (distance(centre, grid) < 2)
						square_set_feat(c, grid, FEAT_GRANITE);
				}
			}
			/* ...with door and stairs */
			square_set_feat(c, loc(mid[y1], y1 + 1), FEAT_CLOSED);
			square_set_feat(c, centre, FEAT_MORE);
			if (level_topography(last_place) == TOP_CAVE) {
				player_place(c, p, centre);
			}
		} else {
			/* Must be Nargothrond */
			/* This place is hard to get into... */
			centre = loc(mid[y1] - 6, y1);
			for (grid.y = y1 - 1; grid.y < y1 + 2; grid.y++) {
				for (grid.x = mid[y1] - 15; grid.x < mid[y1] - 5; grid.x++) {
					if (loc_eq(grid, centre)) {
						square_set_feat(c, grid, FEAT_MORE);
						if (level_topography(last_place) == TOP_CAVE) {
							player_place(c, p, grid);
						}
					} else {
						square_set_feat(c, grid, FEAT_GRANITE);
					}
				}
				for (grid.x = mid[y1] - 5; grid.x < mid[y1]; grid.x++) {
					square_set_feat(c, grid, FEAT_ROAD);
				}
				for (grid.x = mid[y1] - 4; grid.x < mid[y1] + 5; grid.x++) {
					square_set_feat(c, grid, FEAT_WATER);
				}
			}
		}
	}

	/* Place some formations */
	while (form_grids < 50 * c->depth + 1000) {
		/* Choose a place */
		grid.y = randint1(c->height - 2);
		grid.x = randint1(c->width - 2);

		form_grids += make_formation(c, p, grid, FEAT_GRASS, FEAT_GRASS,
									 form_feats, "River", c->depth / 2);
	}

	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);
		}
	}

	/* Move the player out of the river */
	grid = p->grid;
	while ((square_feat(c, grid)->fidx == FEAT_WATER)
		   || (square_feat(c, grid)->fidx == FEAT_GRANITE)) {
		grid.x++;
	}

	/* Place player if they had to move */
	if (!loc_eq(grid, p->grid)) {
		player_place(c, p, grid);
		square_set_feat(c, grid, path);
		for (grid.y = p->grid.y; grid.y > 0; grid.y--) {
			if (!square_ispassable(c, grid)) {
				square_set_feat(c, grid, FEAT_ROAD);
			}
		}
	}

	/* Place objects, traps and monsters */
	(void) populate(c, false);

	mem_free(mid);

	if (!verify_level(c)) {
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "wilderness level had generation issues";
		return NULL;
	}

	return c;
}